

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_renorme(opj_mqc_t *mqc)

{
  OPJ_UINT32 *pOVar1;
  OPJ_UINT32 OVar2;
  
  OVar2 = mqc->a;
  do {
    OVar2 = OVar2 * 2;
    mqc->a = OVar2;
    mqc->c = mqc->c << 1;
    pOVar1 = &mqc->ct;
    *pOVar1 = *pOVar1 - 1;
    if (*pOVar1 == 0) {
      opj_mqc_byteout(mqc);
      OVar2 = mqc->a;
    }
  } while (-1 < (short)OVar2);
  return;
}

Assistant:

static void opj_mqc_renorme(opj_mqc_t *mqc)
{
    do {
        mqc->a <<= 1;
        mqc->c <<= 1;
        mqc->ct--;
        if (mqc->ct == 0) {
            opj_mqc_byteout(mqc);
        }
    } while ((mqc->a & 0x8000) == 0);
}